

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void update_pcrange(attr *attr,attr_val *val,pcrange *pcrange)

{
  dwarf_attribute dVar1;
  attr_val_encoding aVar2;
  
  dVar1 = attr->name;
  if (dVar1 == DW_AT_ranges) {
    aVar2 = val->encoding;
    if (aVar2 == ATTR_VAL_UINT) {
LAB_0012fe1d:
      pcrange->ranges = (uint64_t)val->u;
      pcrange->have_ranges = 1;
      return;
    }
    if (aVar2 == ATTR_VAL_RNGLISTS_INDEX) {
      pcrange->ranges = (uint64_t)val->u;
      pcrange->have_ranges = 1;
      pcrange->ranges_is_index = 1;
    }
    else if (aVar2 == ATTR_VAL_REF_SECTION) goto LAB_0012fe1d;
  }
  else if (dVar1 == DW_AT_high_pc) {
    aVar2 = val->encoding;
    if (aVar2 == ATTR_VAL_UINT) {
      pcrange->highpc = (uintptr_t)val->u;
      pcrange->have_highpc = 1;
      pcrange->highpc_is_relative = 1;
      return;
    }
    if (aVar2 == ATTR_VAL_ADDRESS_INDEX) {
      pcrange->highpc = (uintptr_t)val->u;
      pcrange->have_highpc = 1;
      pcrange->highpc_is_addr_index = 1;
      return;
    }
    if (aVar2 == ATTR_VAL_ADDRESS) {
      pcrange->highpc = (uintptr_t)val->u;
      pcrange->have_highpc = 1;
      return;
    }
  }
  else if (dVar1 == DW_AT_low_pc) {
    if (val->encoding == ATTR_VAL_ADDRESS_INDEX) {
      pcrange->lowpc = (uintptr_t)val->u;
      pcrange->have_lowpc = 1;
      pcrange->lowpc_is_addr_index = 1;
      return;
    }
    if (val->encoding == ATTR_VAL_ADDRESS) {
      pcrange->lowpc = (uintptr_t)val->u;
      pcrange->have_lowpc = 1;
      return;
    }
  }
  return;
}

Assistant:

static void
update_pcrange (const struct attr* attr, const struct attr_val* val,
		struct pcrange *pcrange)
{
  switch (attr->name)
    {
    case DW_AT_low_pc:
      if (val->encoding == ATTR_VAL_ADDRESS)
	{
	  pcrange->lowpc = (uintptr_t) val->u.uint;
	  pcrange->have_lowpc = 1;
	}
      else if (val->encoding == ATTR_VAL_ADDRESS_INDEX)
	{
	  pcrange->lowpc = (uintptr_t) val->u.uint;
	  pcrange->have_lowpc = 1;
	  pcrange->lowpc_is_addr_index = 1;
	}
      break;

    case DW_AT_high_pc:
      if (val->encoding == ATTR_VAL_ADDRESS)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	}
      else if (val->encoding == ATTR_VAL_UINT)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	  pcrange->highpc_is_relative = 1;
	}
      else if (val->encoding == ATTR_VAL_ADDRESS_INDEX)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	  pcrange->highpc_is_addr_index = 1;
	}
      break;

    case DW_AT_ranges:
      if (val->encoding == ATTR_VAL_UINT
	  || val->encoding == ATTR_VAL_REF_SECTION)
	{
	  pcrange->ranges = val->u.uint;
	  pcrange->have_ranges = 1;
	}
      else if (val->encoding == ATTR_VAL_RNGLISTS_INDEX)
	{
	  pcrange->ranges = val->u.uint;
	  pcrange->have_ranges = 1;
	  pcrange->ranges_is_index = 1;
	}
      break;

    default:
      break;
    }
}